

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

TriggerStep *
sqlite3TriggerDeleteStep(Parse *pParse,Token *pTableName,Expr *pWhere,char *zStart,char *zEnd)

{
  TriggerStep *p;
  Expr *pEVar1;
  sqlite3 *in_RCX;
  Expr *in_RDX;
  undefined8 in_RSI;
  Parse *in_RDI;
  Expr *in_R8;
  TriggerStep *pTriggerStep;
  sqlite3 *db;
  sqlite3 *db_00;
  
  db_00 = in_RDI->db;
  p = triggerStepAllocate(in_RDI,(u8)((ulong)in_RSI >> 0x38),(Token *)in_RDX,(char *)in_RCX,
                          (char *)in_R8);
  if (p != (TriggerStep *)0x0) {
    if (in_RDI->eParseMode < 2) {
      pEVar1 = sqlite3ExprDup(in_RCX,in_R8,(int)((ulong)db_00 >> 0x20));
      p->pWhere = pEVar1;
    }
    else {
      p->pWhere = in_RDX;
    }
    p->orconf = '\v';
  }
  sqlite3ExprDelete(db_00,(Expr *)p);
  return p;
}

Assistant:

SQLITE_PRIVATE TriggerStep *sqlite3TriggerDeleteStep(
  Parse *pParse,          /* Parser */
  Token *pTableName,      /* The table from which rows are deleted */
  Expr *pWhere,           /* The WHERE clause */
  const char *zStart,     /* Start of SQL text */
  const char *zEnd        /* End of SQL text */
){
  sqlite3 *db = pParse->db;
  TriggerStep *pTriggerStep;

  pTriggerStep = triggerStepAllocate(pParse, TK_DELETE, pTableName,zStart,zEnd);
  if( pTriggerStep ){
    if( IN_RENAME_OBJECT ){
      pTriggerStep->pWhere = pWhere;
      pWhere = 0;
    }else{
      pTriggerStep->pWhere = sqlite3ExprDup(db, pWhere, EXPRDUP_REDUCE);
    }
    pTriggerStep->orconf = OE_Default;
  }
  sqlite3ExprDelete(db, pWhere);
  return pTriggerStep;
}